

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

PrimaryHeader *
lrit::getHeader<lrit::PrimaryHeader>(PrimaryHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  HeaderReader<lrit::PrimaryHeader> local_38;
  
  local_38.b_ = b;
  local_38.p_ = pos;
  HeaderReader<lrit::PrimaryHeader>::getHeader(&local_38);
  __return_storage_ptr__->fileType =
       ((local_38.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start[local_38.p_];
  puVar2 = ((local_38.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)(puVar2 + (local_38.p_ + 1));
  __return_storage_ptr__->totalHeaderLength =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar3 = *(ulong *)(puVar2 + (local_38.p_ + 5));
  __return_storage_ptr__->dataLength =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  return __return_storage_ptr__;
}

Assistant:

PrimaryHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<PrimaryHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.fileType);
  r.read(&h.totalHeaderLength);
  r.read(&h.dataLength);
  return h;
}